

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O1

bool __thiscall
ON_SubDQuadNeighborhood::Set(ON_SubDQuadNeighborhood *this,ON_SubDFace *center_quad_face)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  bool bVar4;
  uchar uVar5;
  ON_SubDFace *pOVar7;
  ON_SubDVertex *pOVar8;
  ON_SubDVertex *pOVar9;
  ON_SubDFace *pOVar10;
  ON_SubDEdgePtr OVar11;
  int iVar12;
  ON_SubDSectorIterator *pOVar13;
  ON_SubDSectorIterator *pOVar14;
  ulong uVar15;
  uint qfei;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  uint qfei_1;
  ON_SubDEdge *this_00;
  ON_SubDVertex **ppOVar19;
  bool bVar20;
  byte bVar21;
  bool bIsDartVertex [4];
  bool bIsCreaseEdge [4];
  ON_SubDFace *corner_faces [4];
  ON_SubDFace *qf_nbr_face [4];
  ON_SubDVertex *qf_vertex [4];
  ON_SubDVertex *outer_vertex [12];
  ON_SubDEdge *local_1f0;
  ON_SubDVertex *local_1d8;
  StopAt aSStack_1cc [4];
  long local_1c8;
  ON_SubDQuadNeighborhood *local_1c0;
  ulong local_1b8;
  char acStack_1ac [4];
  ON_SubDEdge *(*local_1a8) [2];
  ON_SubDVertex **local_1a0;
  ON_SubDFace *local_198 [4];
  long local_178;
  ON_SubDFace *pOStack_170;
  ON_SubDFace *local_168;
  ON_SubDFace *pOStack_160;
  ON_SubDSectorIterator local_158;
  ON_SubDEdge *(*local_108) [2];
  ulong local_100;
  ON_SubDVertex *local_f8 [4];
  ON_SubDVertex *local_d8;
  ON_SubDVertex *pOStack_d0;
  ON_SubDVertex *local_c8;
  ON_SubDVertex *pOStack_c0;
  ON_SubDVertex *local_b8;
  ON_SubDVertex *pOStack_b0;
  ON_SubDVertex *local_a8;
  ON_SubDVertex *pOStack_a0;
  ON_SubDVertex *local_98;
  ON_SubDVertex *pOStack_90;
  ON_SubDVertex *local_88;
  ON_SubDVertex *pOStack_80;
  ON_SubDSectorIterator local_78;
  uint uVar6;
  
  bVar21 = 0;
  Internal_Destroy(this,true);
  this->m_fsh = (ON_SubD_FixedSizeHeap *)0x0;
  if (center_quad_face == (ON_SubDFace *)0x0) {
    bVar4 = true;
  }
  else {
    if (center_quad_face->m_edge_count == 4) {
      lVar16 = 0;
      do {
        uVar18 = center_quad_face->m_edge4[lVar16].m_ptr;
        this_00 = (ON_SubDEdge *)(uVar18 & 0xfffffffffffffff8);
        if (((this_00 == (ON_SubDEdge *)0x0) || (this_00->m_vertex[0] == (ON_SubDVertex *)0x0)) ||
           (this_00->m_vertex[1] == (ON_SubDVertex *)0x0)) goto LAB_00625613;
        bVar4 = ON_SubDEdge::IsCrease(this_00);
        acStack_1ac[lVar16] = bVar4;
        this->m_center_edges[lVar16] = this_00;
        pOVar8 = this_00->m_vertex[(uint)uVar18 & 1];
        local_f8[lVar16] = pOVar8;
        bVar4 = ON_SubDVertex::IsDart(pOVar8);
        aSStack_1cc[lVar16] = bVar4;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      lVar16 = 0x14;
      do {
        if (lVar16 == 0x18) {
          local_168 = (ON_SubDFace *)0x0;
          pOStack_160 = (ON_SubDFace *)0x0;
          local_178 = 0;
          pOStack_170 = (ON_SubDFace *)0x0;
          lVar16 = 0;
          do {
            if (((acStack_1ac[lVar16] == '\x01') && (aSStack_1cc[lVar16] == Boundary)) &&
               (aSStack_1cc[(int)lVar16 + 1U & 3] == Boundary)) {
              this->m_bBoundaryCrease[lVar16] = true;
              this->m_boundary_crease_count = this->m_boundary_crease_count + '\x01';
            }
            else {
              pOVar7 = ON_SubDEdge::NeighborFace
                                 (this->m_center_edges[lVar16],center_quad_face,false);
              (&local_178)[lVar16] = (long)pOVar7;
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != 4);
          uVar18 = 0;
          local_158.m_current_ring_index = 0;
          local_158.m_current_fei[0] = 0;
          local_158.m_current_fei[1] = 0;
          local_158.m_initial_face_dir = 0;
          local_158.m_current_face_dir = 0;
          local_158.m_current_eptr[1].m_ptr = 0;
          local_158.m_initial_fvi = 0;
          local_158.m_current_fvi = 0;
          local_158.m_current_face = (ON_SubDFace *)0x0;
          local_158.m_current_eptr[0].m_ptr = 0;
          local_158.m_center_vertex = (ON_SubDVertex *)0x0;
          local_158.m_initial_face = (ON_SubDFace *)0x0;
          local_78.m_current_ring_index = 0;
          local_78.m_current_fei[0] = 0;
          local_78.m_current_fei[1] = 0;
          local_78.m_initial_face_dir = 0;
          local_78.m_current_face_dir = 0;
          local_78.m_current_eptr[1].m_ptr = 0;
          local_78.m_initial_fvi = 0;
          local_78.m_current_fvi = 0;
          local_78.m_current_face = (ON_SubDFace *)0x0;
          local_78.m_current_eptr[0].m_ptr = 0;
          local_78.m_center_vertex = (ON_SubDVertex *)0x0;
          local_78.m_initial_face = (ON_SubDFace *)0x0;
          this->m_face_grid[1][1] = center_quad_face;
          this->m_face_grid[1][0] = (ON_SubDFace *)local_178;
          this->m_face_grid[2][1] = pOStack_170;
          this->m_face_grid[1][2] = local_168;
          this->m_face_grid[0][1] = pOStack_160;
          this->m_vertex_grid[1][1] = local_f8[0];
          this->m_vertex_grid[2][1] = local_f8[1];
          this->m_vertex_grid[2][2] = local_f8[2];
          this->m_vertex_grid[1][2] = local_f8[3];
          local_198[2] = (ON_SubDFace *)0x0;
          local_198[3] = (ON_SubDFace *)0x0;
          local_198[0] = (ON_SubDFace *)0x0;
          local_198[1] = (ON_SubDFace *)0x0;
          local_88 = (ON_SubDVertex *)0x0;
          pOStack_80 = (ON_SubDVertex *)0x0;
          local_98 = (ON_SubDVertex *)0x0;
          pOStack_90 = (ON_SubDVertex *)0x0;
          local_a8 = (ON_SubDVertex *)0x0;
          pOStack_a0 = (ON_SubDVertex *)0x0;
          local_b8 = (ON_SubDVertex *)0x0;
          pOStack_b0 = (ON_SubDVertex *)0x0;
          local_c8 = (ON_SubDVertex *)0x0;
          pOStack_c0 = (ON_SubDVertex *)0x0;
          local_1a0 = &pOStack_80;
          local_d8 = (ON_SubDVertex *)0x0;
          pOStack_d0 = (ON_SubDVertex *)0x0;
          uVar17 = 9;
          ppOVar19 = &pOStack_d0;
          local_108 = this->m_edge_grid;
          local_1a8 = this->m_edge_grid;
          bVar4 = false;
          local_1c0 = this;
          do {
            auVar1._8_8_ = 0;
            auVar1._0_8_ = uVar17;
            uVar15 = (ulong)((uint)uVar18 - 1 & 3);
            pOVar7 = (ON_SubDFace *)(&local_178)[uVar18];
            if ((pOVar7 == (ON_SubDFace *)0x0) && ((&local_178)[uVar15] == 0)) {
              iVar12 = 0xd;
            }
            else {
              local_1b8 = uVar15;
              local_100 = SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
              pOVar8 = ON_SubDSectorIterator::Initialize(&local_158,center_quad_face,0,(uint)uVar18)
              ;
              if (pOVar8 == (ON_SubDVertex *)0x0) {
LAB_006258ab:
                ON_SubDIncrementErrorCount();
                iVar12 = 1;
              }
              else {
                pOVar8 = local_f8[uVar18];
                pOVar9 = ON_SubDSectorIterator::CenterVertex(&local_158);
                if (pOVar8 == pOVar9) {
                  pOVar13 = &local_158;
                  pOVar14 = &local_78;
                  for (lVar16 = 8; lVar16 != 0; lVar16 = lVar16 + -1) {
                    pOVar14->m_center_vertex = pOVar13->m_center_vertex;
                    pOVar13 = (ON_SubDSectorIterator *)((long)pOVar13 + (ulong)bVar21 * -0x10 + 8);
                    pOVar14 = (ON_SubDSectorIterator *)
                              ((long)pOVar14 + ((ulong)bVar21 * -2 + 1) * 8);
                  }
                  local_78.m_current_ring_index = local_158.m_current_ring_index;
                  if (pOVar8->m_edge_count == 4) {
                    bVar20 = 2 < pOVar8->m_face_count;
                  }
                  else {
                    bVar20 = false;
                  }
                  if (pOVar7 == (ON_SubDFace *)0x0) {
                    local_1f0 = (ON_SubDEdge *)0x0;
                    uVar15 = 0;
                    local_1d8 = (ON_SubDVertex *)0x0;
                    lVar16 = 0;
                    this = local_1c0;
LAB_0062590f:
                    if (uVar15 == 0) {
                      pOVar7 = (ON_SubDFace *)(&local_178)[local_1b8];
                      if (pOVar7 == (ON_SubDFace *)0x0) {
                        uVar15 = 0;
                      }
                      else {
                        pOVar10 = ON_SubDSectorIterator::NextFace(&local_78,Boundary);
                        if (pOVar7 != pOVar10) {
                          ON_SubDIncrementErrorCount();
                          iVar12 = 1;
                          goto LAB_006258b9;
                        }
                        OVar11 = ON_SubDSectorIterator::CurrentEdgePtr(&local_78,1);
                        uVar15 = OVar11.m_ptr & 0xfffffffffffffff8;
                        if ((uVar15 == 0) ||
                           (lVar16 = *(long *)(uVar15 + 0x80 + (ulong)(~(uint)OVar11.m_ptr & 1) * 8)
                           , lVar16 == 0)) goto LAB_00625bc2;
                        if ((!bVar20) || (local_198[uVar18] != (ON_SubDFace *)0x0))
                        goto LAB_00625918;
                        local_1c8 = lVar16;
                        pOVar7 = ON_SubDSectorIterator::NextFace
                                           (&local_78,aSStack_1cc[local_1b8] ^ AnyCrease);
                        local_198[uVar18] = pOVar7;
                        iVar12 = 0;
                        if ((local_1f0 == (ON_SubDEdge *)0x0) && (pOVar7 != (ON_SubDFace *)0x0)) {
                          OVar11 = ON_SubDSectorIterator::CurrentEdgePtr(&local_78,1);
                          local_1f0 = (ON_SubDEdge *)(OVar11.m_ptr & 0xfffffffffffffff8);
                          if (local_1f0 == (ON_SubDEdge *)0x0) {
                            local_1f0 = (ON_SubDEdge *)0x0;
                          }
                          else {
                            local_1d8 = local_1f0->m_vertex[~(uint)OVar11.m_ptr & 1];
                            iVar12 = 0xe;
                            if (local_1d8 != (ON_SubDVertex *)0x0) goto LAB_00625c9b;
                            local_1d8 = (ON_SubDVertex *)0x0;
                          }
                          ON_SubDIncrementErrorCount();
                          iVar12 = 1;
                        }
LAB_00625c9b:
                        lVar16 = local_1c8;
                        if ((iVar12 != 0xe) && (iVar12 != 0)) goto LAB_006258b9;
                      }
                    }
LAB_00625918:
                    if (local_198[uVar18] != (ON_SubDFace *)0x0) {
                      local_1c8 = lVar16;
                      pOVar8 = ON_SubDFace::QuadOppositeVertex(local_198[uVar18],pOVar8);
                      ppOVar19[-1] = pOVar8;
                      lVar16 = local_1c8;
                    }
                    if (local_1f0 != (ON_SubDEdge *)0x0) {
                      (*local_1a8)[0] = local_1f0;
                      *ppOVar19 = local_1d8;
                    }
                    iVar12 = 0;
                    if (uVar15 != 0) {
                      *(ulong *)((long)*local_108 + (ulong)(uint)((int)local_1b8 << 4) + 8) = uVar15
                      ;
                      *(long *)((long)local_1a0 + (local_100 & 0x3ffffffffffffff8) * -0xc) = lVar16;
                    }
                  }
                  else {
                    pOVar10 = ON_SubDSectorIterator::PrevFace(&local_158,Boundary);
                    this = local_1c0;
                    if (pOVar7 != pOVar10) goto LAB_006258ab;
                    OVar11 = ON_SubDSectorIterator::CurrentEdgePtr(&local_158,0);
                    local_1f0 = (ON_SubDEdge *)(OVar11.m_ptr & 0xfffffffffffffff8);
                    if ((local_1f0 != (ON_SubDEdge *)0x0) &&
                       (local_1d8 = local_1f0->m_vertex[~(uint)OVar11.m_ptr & 1],
                       local_1d8 != (ON_SubDVertex *)0x0)) {
                      if (!bVar20) {
                        uVar15 = 0;
                        lVar16 = 0;
                        goto LAB_0062590f;
                      }
                      pOVar7 = ON_SubDSectorIterator::PrevFace
                                         (&local_158,aSStack_1cc[uVar18] ^ AnyCrease);
                      local_198[uVar18] = pOVar7;
                      if (pOVar7 == (ON_SubDFace *)0x0) {
                        uVar15 = 0;
                        lVar16 = 0;
                        iVar12 = 0;
                      }
                      else {
                        OVar11 = ON_SubDSectorIterator::CurrentEdgePtr(&local_158,0);
                        uVar15 = OVar11.m_ptr & 0xfffffffffffffff8;
                        if (uVar15 == 0) {
                          uVar15 = 0;
                        }
                        else {
                          lVar16 = *(long *)(uVar15 + 0x80 + (ulong)(~(uint)OVar11.m_ptr & 1) * 8);
                          iVar12 = 0xe;
                          if (lVar16 != 0) goto LAB_00625c01;
                        }
                        ON_SubDIncrementErrorCount();
                        iVar12 = 1;
                        lVar16 = 0;
                      }
LAB_00625c01:
                      if (iVar12 != 0xe) {
                        if (iVar12 != 0) goto LAB_006258b9;
                        goto LAB_0062590f;
                      }
                      goto LAB_00625918;
                    }
LAB_00625bc2:
                    ON_SubDIncrementErrorCount();
                    iVar12 = 1;
                  }
                }
                else {
                  ON_SubDIncrementErrorCount();
                  iVar12 = 1;
                  this = local_1c0;
                }
              }
            }
LAB_006258b9:
            if ((iVar12 != 0xd) && (iVar12 != 0)) {
              return bVar4;
            }
            bVar4 = 2 < uVar18;
            uVar18 = uVar18 + 1;
            local_1a0 = local_1a0 + 3;
            uVar17 = uVar17 + 3;
            ppOVar19 = ppOVar19 + 3;
            local_1a8 = local_1a8 + 1;
            if (uVar18 == 4) {
              this->m_face_grid[0][0] = local_198[0];
              this->m_face_grid[2][0] = local_198[1];
              this->m_face_grid[2][2] = local_198[2];
              this->m_face_grid[0][2] = local_198[3];
              this->m_vertex_grid[0][0] = local_d8;
              this->m_vertex_grid[1][0] = pOStack_d0;
              this->m_vertex_grid[2][0] = local_c8;
              this->m_vertex_grid[3][0] = pOStack_c0;
              this->m_vertex_grid[3][1] = local_b8;
              this->m_vertex_grid[3][2] = pOStack_b0;
              this->m_vertex_grid[3][3] = local_a8;
              this->m_vertex_grid[2][3] = pOStack_a0;
              this->m_vertex_grid[1][3] = local_98;
              this->m_vertex_grid[0][3] = pOStack_90;
              this->m_vertex_grid[0][2] = local_88;
              this->m_vertex_grid[0][1] = pOStack_80;
              if (center_quad_face->m_level_zero_face_id == 0) {
                uVar5 = '\0';
              }
              else {
                uVar6 = ON_SubDComponentBase::SubdivisionLevel
                                  (&center_quad_face->super_ON_SubDComponentBase);
                uVar5 = (uchar)uVar6;
              }
              this->m_initial_subdivision_level = uVar5;
              this->m_current_subdivision_level = uVar5;
              SetPatchStatus(this,0);
              return bVar4;
            }
          } while( true );
        }
        lVar2 = lVar16 + -3;
        iVar12 = (int)lVar16;
        lVar3 = lVar16 + 1;
        lVar16 = lVar16 + 1;
      } while (local_f8[iVar12 - 0x13U & 3] ==
               (ON_SubDVertex *)
               (*(ON_SubDVertex *(*) [4])(this->m_edge_grid + -2))[lVar3]->m_P
               [~*(uint *)((center_quad_face->super_ON_SubDComponentBase).m_saved_subd_point1 +
                          lVar2) & 1]);
    }
LAB_00625613:
    ON_SubDIncrementErrorCount();
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ON_SubDQuadNeighborhood::Set(
  const ON_SubDFace* center_quad_face
  )
{
  ON_SubDQuadNeighborhood::Clear(this, false);

  if (nullptr == center_quad_face)
    return true;

  if (4 != center_quad_face->m_edge_count)
    return ON_SUBD_RETURN_ERROR(false);

  const ON_SubDVertex* qf_vertex[4];
  bool bIsDartVertex[4];
  bool bIsCreaseEdge[4];
  for (unsigned int qfei = 0; qfei < 4; qfei++)
  {
    const ON__UINT_PTR eptr = center_quad_face->m_edge4[qfei].m_ptr;
    const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(eptr);
    if (nullptr == edge)
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == edge->m_vertex[0])
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == edge->m_vertex[1])
      return ON_SUBD_RETURN_ERROR(false);

    bIsCreaseEdge[qfei] = edge->IsCrease();

    m_center_edges[qfei] = edge;

    qf_vertex[qfei] = edge->m_vertex[ON_SUBD_EDGE_DIRECTION(eptr)];
    
    bIsDartVertex[qfei] = qf_vertex[qfei]->IsDart();
  }

  for (unsigned int qfei = 0; qfei < 4; qfei++)
  {
    ON__UINT_PTR ev1 = 1-ON_SUBD_EDGE_DIRECTION(center_quad_face->m_edge4[qfei].m_ptr);
    if ( qf_vertex[(qfei+1)%4] != m_center_edges[qfei]->m_vertex[ev1] )
      return ON_SUBD_RETURN_ERROR(false);
  }
  
  const ON_SubDFace* qf_nbr_face[4] = {};
  for (unsigned int qfei = 0; qfei < 4; qfei++)
  {
    if (bIsCreaseEdge[qfei] && false == bIsDartVertex[qfei] && false == bIsDartVertex[(qfei+1)%4])
    {
      m_bBoundaryCrease[qfei] = true;
      m_boundary_crease_count++;
      continue;
    }
    qf_nbr_face[qfei] = m_center_edges[qfei]->NeighborFace(center_quad_face, false);
  }

  ON_SubDSectorIterator sit0, sit1;

  m_face_grid[1][1] = center_quad_face;
  m_face_grid[1][0] = qf_nbr_face[0];
  m_face_grid[2][1] = qf_nbr_face[1];
  m_face_grid[1][2] = qf_nbr_face[2];
  m_face_grid[0][1] = qf_nbr_face[3];

  m_vertex_grid[1][1] = qf_vertex[0];
  m_vertex_grid[2][1] = qf_vertex[1];
  m_vertex_grid[2][2] = qf_vertex[2];
  m_vertex_grid[1][2] = qf_vertex[3];

  const ON_SubDFace* corner_faces[4] = {};
  const ON_SubDVertex* outer_vertex[12] = {};

  for (unsigned int qfei = 0; qfei < 4; qfei++)
  {
    const unsigned int qfei3 = (qfei+3)%4;

    if ( nullptr == qf_nbr_face[qfei] && nullptr == qf_nbr_face[qfei3])
      continue;

    if (nullptr == sit0.Initialize(center_quad_face, 0, qfei))
      return ON_SUBD_RETURN_ERROR(false);

    if (qf_vertex[qfei] != sit0.CenterVertex())
      return ON_SUBD_RETURN_ERROR(false);

    sit1 = sit0;

    const bool b4EdgedCorner = (4 == qf_vertex[qfei]->m_edge_count && qf_vertex[qfei]->m_face_count >= 3);
    const ON_SubDEdge* e[2] = {};
    const ON_SubDVertex* v[2] = {};
    ON__UINT_PTR eptr;

    for (;;)
    {
      if (nullptr != qf_nbr_face[qfei])
      {
        if (qf_nbr_face[qfei] != sit0.PrevFace(ON_SubDSectorIterator::StopAt::Boundary))
          return ON_SUBD_RETURN_ERROR(false);
        eptr = sit0.CurrentEdgePtr(0).m_ptr;
        e[0] = ON_SUBD_EDGE_POINTER(eptr);
        if (nullptr == e[0])
          return ON_SUBD_RETURN_ERROR(false);
        v[0] = e[0]->m_vertex[1 - ON_SUBD_EDGE_DIRECTION(eptr)];
        if (nullptr == v[0])
          return ON_SUBD_RETURN_ERROR(false);
        
        if (b4EdgedCorner)
        {
          ON_SubDSectorIterator::StopAt stop_at
            = bIsDartVertex[qfei]
            ? ON_SubDSectorIterator::StopAt::Boundary
            : ON_SubDSectorIterator::StopAt::AnyCrease
            ;
          corner_faces[qfei] = sit0.PrevFace(stop_at);
          if (nullptr != corner_faces[qfei])
          {
            eptr = sit0.CurrentEdgePtr(0).m_ptr;
            e[1] = ON_SUBD_EDGE_POINTER(eptr);
            if (nullptr == e[1])
              return ON_SUBD_RETURN_ERROR(false);
            v[1] = e[1]->m_vertex[1 - ON_SUBD_EDGE_DIRECTION(eptr)];
            if (nullptr == v[1])
              return ON_SUBD_RETURN_ERROR(false);
            break;
          }
        }
      }

      if (nullptr == e[1] && nullptr != qf_nbr_face[qfei3])
      {
        if (qf_nbr_face[qfei3] != sit1.NextFace(ON_SubDSectorIterator::StopAt::Boundary))
          return ON_SUBD_RETURN_ERROR(false);
        eptr = sit1.CurrentEdgePtr(1).m_ptr;
        e[1] = ON_SUBD_EDGE_POINTER(eptr);
        if (nullptr == e[1])
          return ON_SUBD_RETURN_ERROR(false);
        v[1] = e[1]->m_vertex[1 - ON_SUBD_EDGE_DIRECTION(eptr)];
        if (nullptr == v[1])
          return ON_SUBD_RETURN_ERROR(false);
        if (b4EdgedCorner && nullptr == corner_faces[qfei])
        {
          ON_SubDSectorIterator::StopAt stop_at
            = bIsDartVertex[qfei3]
            ? ON_SubDSectorIterator::StopAt::Boundary
            : ON_SubDSectorIterator::StopAt::AnyCrease
            ;
          corner_faces[qfei] = sit1.NextFace(stop_at);
          if (nullptr != corner_faces[qfei] && nullptr == e[0] )
          {
            eptr = sit1.CurrentEdgePtr(1).m_ptr;
            e[0] = ON_SUBD_EDGE_POINTER(eptr);
            if (nullptr == e[0])
              return ON_SUBD_RETURN_ERROR(false);
            v[0] = e[0]->m_vertex[1 - ON_SUBD_EDGE_DIRECTION(eptr)];
            if (nullptr == v[0])
              return ON_SUBD_RETURN_ERROR(false);
            break;
          }
        }
      }
      break;
    }

    if ( nullptr != corner_faces[qfei] )
      outer_vertex[3 * qfei] = corner_faces[qfei]->QuadOppositeVertex(qf_vertex[qfei]);

    if (nullptr != e[0])
    {
      m_edge_grid[qfei][0] = e[0];
      outer_vertex[3 * qfei + 1] = v[0];
    }

    if (nullptr != e[1])
    {
      m_edge_grid[qfei3][1] = e[1];
      outer_vertex[(3 * qfei + 11) % 12] = v[1];
    }   
  }

  m_face_grid[0][0] = corner_faces[0]; // lower left corner
  m_face_grid[2][0] = corner_faces[1]; // lower right corner
  m_face_grid[2][2] = corner_faces[2]; // upper right corner
  m_face_grid[0][2] = corner_faces[3]; // upper left corner

  m_vertex_grid[0][0] = outer_vertex[0]; // lower left corner
  m_vertex_grid[1][0] = outer_vertex[1];
  m_vertex_grid[2][0] = outer_vertex[2];
  
  m_vertex_grid[3][0] = outer_vertex[3]; // lower right corner
  m_vertex_grid[3][1] = outer_vertex[4];
  m_vertex_grid[3][2] = outer_vertex[5];

  m_vertex_grid[3][3] = outer_vertex[6]; // upper right corner
  m_vertex_grid[2][3] = outer_vertex[7];
  m_vertex_grid[1][3] = outer_vertex[8];
  
  m_vertex_grid[0][3] = outer_vertex[9]; // upper left corner
  m_vertex_grid[0][2] = outer_vertex[10];
  m_vertex_grid[0][1] = outer_vertex[11];

  m_initial_subdivision_level = (unsigned char)(center_quad_face->m_level_zero_face_id > 0 ? center_quad_face->SubdivisionLevel() : 0U);
  m_current_subdivision_level = m_initial_subdivision_level;
  
  SetPatchStatus(0);
  
#if defined(ON_DEBUG)
  IsValid(); // will trigger a break if "this" is not valid
#endif
  
  return true;
}